

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O3

void __thiscall FTraceInfo::SetSourcePosition(FTraceInfo *this)

{
  FTraceResults *pFVar1;
  double dVar2;
  double y;
  
  pFVar1 = this->Results;
  (pFVar1->SrcFromTarget).Z = (this->Start).Z;
  dVar2 = (this->Start).Y;
  (pFVar1->SrcFromTarget).X = (this->Start).X;
  (pFVar1->SrcFromTarget).Y = dVar2;
  (pFVar1->HitVector).Z = (this->Vec).Z;
  dVar2 = (this->Vec).X;
  y = (this->Vec).Y;
  (pFVar1->HitVector).X = dVar2;
  (pFVar1->HitVector).Y = y;
  dVar2 = c_atan2(y,dVar2);
  (this->Results->SrcAngleFromTarget).Degrees = dVar2 * 57.29577951308232;
  return;
}

Assistant:

void SetSourcePosition()
	{
		Results->SrcFromTarget = Start;
		Results->HitVector = Vec;
		Results->SrcAngleFromTarget = Results->HitVector.Angle();
	}